

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSparseSDF.h
# Opt level: O2

void __thiscall btSparseSdf<3>::BuildCell(btSparseSdf<3> *this,Cell *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Cell *pCVar8;
  int i;
  long lVar9;
  int j;
  long lVar10;
  btScalar bVar11;
  btVector3 local_58;
  Cell *local_48;
  long local_40;
  Cell *local_38;
  
  iVar4 = c->c[0];
  iVar5 = c->c[1];
  iVar6 = c->c[2];
  fVar1 = this->voxelsz;
  pCVar8 = c;
  for (local_40 = 0; local_40 != 4; local_40 = local_40 + 1) {
    iVar7 = (int)local_40;
    fVar2 = this->voxelsz;
    local_48 = pCVar8;
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      fVar3 = this->voxelsz;
      local_38 = pCVar8;
      for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
        local_58.m_floats[0] = (float)(int)lVar9 * this->voxelsz + (float)iVar4 * 3.0 * fVar1;
        local_58.m_floats[3] = 0.0;
        local_58.m_floats[1] = (float)(int)lVar10 * fVar3 + (float)iVar5 * 3.0 * fVar1;
        local_58.m_floats[2] = (float)iVar7 * fVar2 + (float)iVar6 * 3.0 * fVar1;
        bVar11 = DistanceToShape(&local_58,c->pclient);
        pCVar8->d[0][0][0] = bVar11;
        pCVar8 = (Cell *)(pCVar8->d + 1);
      }
      pCVar8 = (Cell *)(local_38->d[0] + 1);
    }
    pCVar8 = (Cell *)(local_48->d[0][0] + 1);
  }
  return;
}

Assistant:

void					BuildCell(Cell& c)
	{
		const btVector3	org=btVector3(	(btScalar)c.c[0],
			(btScalar)c.c[1],
			(btScalar)c.c[2])	*
			CELLSIZE*voxelsz;
		for(int k=0;k<=CELLSIZE;++k)
		{
			const btScalar	z=voxelsz*k+org.z();
			for(int j=0;j<=CELLSIZE;++j)
			{
				const btScalar	y=voxelsz*j+org.y();
				for(int i=0;i<=CELLSIZE;++i)
				{
					const btScalar	x=voxelsz*i+org.x();
					c.d[i][j][k]=DistanceToShape(	btVector3(x,y,z),
						c.pclient);
				}
			}
		}
	}